

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred_avx2.c
# Opt level: O1

void uavs3d_ipred_ang_x_6_avx2(pel *src,pel *dst,int i_dst,int mode,int width,int height)

{
  undefined1 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  int iVar14;
  long lVar15;
  ulong *puVar16;
  ulong uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar29 [16];
  undefined1 uStack_99;
  undefined8 uStack_98;
  undefined8 uStack_90;
  pel apStack_88 [8];
  pel first_line [128];
  undefined1 auVar25 [32];
  undefined1 auVar28 [32];
  
  iVar14 = width + height + -1;
  iVar6 = width * 2;
  iVar5 = iVar6;
  if (iVar14 < iVar6) {
    iVar5 = iVar14;
  }
  puVar16 = (ulong *)(src + 2);
  uVar17 = 0;
  if (8 < iVar5) {
    uVar17 = 0;
    auVar21._8_2_ = 2;
    auVar21._0_8_ = 0x2000200020002;
    auVar21._10_2_ = 2;
    auVar21._12_2_ = 2;
    auVar21._14_2_ = 2;
    auVar21._16_2_ = 2;
    auVar21._18_2_ = 2;
    auVar21._20_2_ = 2;
    auVar21._22_2_ = 2;
    auVar21._24_2_ = 2;
    auVar21._26_2_ = 2;
    auVar21._28_2_ = 2;
    auVar21._30_2_ = 2;
    do {
      auVar18._8_8_ = 0;
      auVar18._0_8_ = *(ulong *)(src + uVar17 + 9);
      auVar23._8_8_ = 0;
      auVar23._0_8_ = *(ulong *)(src + uVar17 + 1);
      auVar22._0_16_ = ZEXT116(0) * auVar18 + ZEXT116(1) * auVar23;
      auVar22._16_16_ = ZEXT116(1) * auVar18;
      auVar26._8_8_ = 0;
      auVar26._0_8_ = *(ulong *)(src + uVar17 + 10);
      auVar24._8_8_ = 0;
      auVar24._0_8_ = *(ulong *)(src + uVar17 + 2);
      auVar25._0_16_ = ZEXT116(0) * auVar26 + ZEXT116(1) * auVar24;
      auVar25._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar26;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = *(ulong *)(src + uVar17 + 0xb);
      auVar29._8_8_ = 0;
      auVar29._0_8_ = *(ulong *)(src + uVar17 + 3);
      auVar28._0_16_ = ZEXT116(0) * auVar27 + ZEXT116(1) * auVar29;
      auVar28._16_16_ = ZEXT116(1) * auVar27;
      auVar19 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
      auVar22 = vpunpcklbw_avx2(auVar22,auVar19);
      auVar25 = vpunpcklbw_avx2(auVar25,auVar19);
      auVar19 = vpunpcklbw_avx2(auVar28,auVar19);
      auVar22 = vpaddw_avx2(auVar22,auVar19);
      auVar25 = vpaddw_avx2(auVar25,auVar25);
      auVar22 = vpaddw_avx2(auVar22,auVar25);
      auVar22 = vpaddw_avx2(auVar22,auVar21);
      auVar22 = vpsrlw_avx2(auVar22,2);
      auVar18 = vpackuswb_avx(auVar22._0_16_,auVar22._16_16_);
      *(undefined1 (*) [16])((long)&uStack_98 + uVar17) = auVar18;
      uVar17 = uVar17 + 0x10;
    } while ((long)uVar17 < (long)(iVar5 + -8));
    puVar16 = (ulong *)((long)puVar16 + uVar17);
  }
  if ((int)uVar17 < iVar5) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = *(ulong *)((long)puVar16 + -1);
    auVar18 = vpmovzxbw_avx(auVar2);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = *puVar16;
    auVar23 = vpmovzxbw_avx(auVar3);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = *(ulong *)((long)puVar16 + 1);
    auVar24 = vpmovzxbw_avx(auVar4);
    auVar18 = vpaddw_avx(auVar18,auVar24);
    auVar23 = vpaddw_avx(auVar23,auVar23);
    auVar18 = vpaddw_avx(auVar18,auVar23);
    auVar20._8_2_ = 2;
    auVar20._0_8_ = 0x2000200020002;
    auVar20._10_2_ = 2;
    auVar20._12_2_ = 2;
    auVar20._14_2_ = 2;
    auVar18 = vpaddw_avx(auVar18,auVar20);
    auVar18 = vpsrlw_avx(auVar18,2);
    auVar18 = vpackuswb_avx(auVar18,auVar18);
    *(long *)((long)&uStack_98 + (uVar17 & 0xffffffff)) = auVar18._0_8_;
  }
  if (iVar6 < iVar14) {
    lVar15 = (long)iVar6;
    do {
      uVar1 = (&uStack_99)[iVar5];
      *(undefined1 *)((long)&uStack_98 + lVar15) = uVar1;
      *(undefined1 *)((long)&uStack_98 + lVar15 + 1) = uVar1;
      *(undefined1 *)((long)&uStack_98 + lVar15 + 2) = uVar1;
      *(undefined1 *)((long)&uStack_98 + lVar15 + 3) = uVar1;
      *(undefined1 *)((long)&uStack_98 + lVar15 + 4) = uVar1;
      *(undefined1 *)((long)&uStack_98 + lVar15 + 5) = uVar1;
      *(undefined1 *)((long)&uStack_98 + lVar15 + 6) = uVar1;
      *(undefined1 *)((long)&uStack_98 + lVar15 + 7) = uVar1;
      *(undefined1 *)((long)&uStack_90 + lVar15) = uVar1;
      *(undefined1 *)((long)&uStack_90 + lVar15 + 1) = uVar1;
      *(undefined1 *)((long)&uStack_90 + lVar15 + 2) = uVar1;
      *(undefined1 *)((long)&uStack_90 + lVar15 + 3) = uVar1;
      *(undefined1 *)((long)&uStack_90 + lVar15 + 4) = uVar1;
      *(undefined1 *)((long)&uStack_90 + lVar15 + 5) = uVar1;
      *(undefined1 *)((long)&uStack_90 + lVar15 + 6) = uVar1;
      *(undefined1 *)((long)&uStack_90 + lVar15 + 7) = uVar1;
      lVar15 = lVar15 + 0x10;
    } while (lVar15 < iVar14);
  }
  if (width < 0x10) {
    if (width == 4) {
      if (0 < height) {
        uVar17 = 0;
        do {
          *(undefined4 *)dst = *(undefined4 *)((long)&uStack_98 + uVar17);
          dst = dst + i_dst;
          uVar17 = uVar17 + 1;
        } while ((uint)height != uVar17);
      }
    }
    else if ((width == 8) && (0 < height)) {
      uVar17 = 0;
      do {
        *(undefined8 *)dst = *(undefined8 *)((long)&uStack_98 + uVar17);
        dst = dst + i_dst;
        uVar17 = uVar17 + 1;
      } while ((uint)height != uVar17);
    }
  }
  else if (width == 0x10) {
    if (0 < height) {
      uVar17 = 0;
      do {
        uVar7 = *(undefined8 *)((long)&uStack_90 + uVar17);
        *(undefined8 *)dst = *(undefined8 *)((long)&uStack_98 + uVar17);
        *(undefined8 *)(dst + 8) = uVar7;
        dst = dst + i_dst;
        uVar17 = uVar17 + 1;
      } while ((uint)height != uVar17);
    }
  }
  else if (width == 0x20) {
    if (0 < height) {
      uVar17 = 0;
      do {
        uVar7 = *(undefined8 *)((long)&uStack_90 + uVar17);
        uVar8 = *(undefined8 *)(first_line + (uVar17 - 8));
        uVar9 = *(undefined8 *)(first_line + uVar17);
        *(undefined8 *)dst = *(undefined8 *)((long)&uStack_98 + uVar17);
        *(undefined8 *)(dst + 8) = uVar7;
        *(undefined8 *)(dst + 0x10) = uVar8;
        *(undefined8 *)(dst + 0x18) = uVar9;
        dst = dst + i_dst;
        uVar17 = uVar17 + 1;
      } while ((uint)height != uVar17);
    }
  }
  else if ((width == 0x40) && (0 < height)) {
    uVar17 = 0;
    do {
      uVar7 = *(undefined8 *)((long)&uStack_98 + uVar17);
      uVar8 = *(undefined8 *)((long)&uStack_90 + uVar17);
      uVar9 = *(undefined8 *)(first_line + (uVar17 - 8));
      uVar10 = *(undefined8 *)(first_line + uVar17);
      uVar11 = *(undefined8 *)(first_line + uVar17 + 0x10);
      uVar12 = *(undefined8 *)(first_line + uVar17 + 0x18);
      uVar13 = *(undefined8 *)(first_line + uVar17 + 0x20);
      *(undefined8 *)(dst + 0x20) = *(undefined8 *)(first_line + uVar17 + 8);
      *(undefined8 *)(dst + 0x28) = uVar11;
      *(undefined8 *)(dst + 0x30) = uVar12;
      *(undefined8 *)(dst + 0x38) = uVar13;
      *(undefined8 *)dst = uVar7;
      *(undefined8 *)(dst + 8) = uVar8;
      *(undefined8 *)(dst + 0x10) = uVar9;
      *(undefined8 *)(dst + 0x18) = uVar10;
      dst = dst + i_dst;
      uVar17 = uVar17 + 1;
    } while ((uint)height != uVar17);
  }
  return;
}

Assistant:

void uavs3d_ipred_ang_x_6_avx2(pel *src, pel *dst, int i_dst, int mode, int width, int height)
{
    ALIGNED_16(pel first_line[64 + 64]);
    int line_size = width + height - 1;
    int real_size = COM_MIN(line_size, width * 2);
    int i;
    __m256i zero = _mm256_setzero_si256();
    __m256i offset = _mm256_set1_epi16(2);
    src += 2;

    for (i = 0; i < real_size - 8; i += 16, src += 16) {
        __m256i S0 = _mm256_set_epi64x(0, *(s64 *)(src + 7), 0, *(s64 *)(src - 1));
        __m256i S1 = _mm256_set_epi64x(0, *(s64 *)(src + 8), 0, *(s64 *)(src));
        __m256i S2 = _mm256_set_epi64x(0, *(s64 *)(src + 9), 0, *(s64 *)(src + 1));

        __m256i L0 = _mm256_unpacklo_epi8(S0, zero);
        __m256i L1 = _mm256_unpacklo_epi8(S1, zero);
        __m256i L2 = _mm256_unpacklo_epi8(S2, zero);

        __m256i sum1 = _mm256_add_epi16(L0, L1);
        __m256i sum2 = _mm256_add_epi16(L1, L2);
        __m128i d0;

        sum1 = _mm256_add_epi16(sum1, sum2);

        sum1 = _mm256_add_epi16(sum1, offset);

        sum1 = _mm256_srli_epi16(sum1, 2);

        d0 = _mm_packus_epi16(_mm256_castsi256_si128(sum1), _mm256_extracti128_si256(sum1, 1));

        _mm_store_si128((__m128i *)&first_line[i], d0);
    }

    if (i < real_size) {
        __m128i zero = _mm_setzero_si128();
        __m128i offset = _mm_set1_epi16(2);
        __m128i S0 = _mm_loadu_si128((__m128i *)(src - 1));
        __m128i S2 = _mm_loadu_si128((__m128i *)(src + 1));
        __m128i S1 = _mm_loadu_si128((__m128i *)(src));

        __m128i L0 = _mm_unpacklo_epi8(S0, zero);
        __m128i L1 = _mm_unpacklo_epi8(S1, zero);
        __m128i L2 = _mm_unpacklo_epi8(S2, zero);

        __m128i sum1 = _mm_add_epi16(L0, L1);
        __m128i sum2 = _mm_add_epi16(L1, L2);

        sum1 = _mm_add_epi16(sum1, sum2);
        sum1 = _mm_add_epi16(sum1, offset);
        sum1 = _mm_srli_epi16(sum1, 2);

        sum1 = _mm_packus_epi16(sum1, sum1);
        _mm_storel_epi64((__m128i *)&first_line[i], sum1);
    }

    // padding
    for (i = real_size; i < line_size; i += 16) {
        __m128i pad = _mm_set1_epi8((char)first_line[real_size - 1]);
        _mm_storeu_si128((__m128i *)&first_line[i], pad);
    }

#define COPY_X6(w) { \
    for (i = 0; i < height; i++) { \
        memcpy(dst, first_line + i, w * sizeof(pel)); \
        dst += i_dst;\
    } \
}
    switch (width) {
    case 4:
        COPY_X6(4)
            break;
    case 8:
        COPY_X6(8)
            break;
    case 16:
        COPY_X6(16)
            break;
    case 32:
        COPY_X6(32)
            break;
    case 64:
        COPY_X6(64)
            break;
    }
}